

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O3

void __thiscall
wavingz::demod::state_machine::symbol_sm::payload_t::process
          (payload_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  bitset<8UL> *pbVar1;
  size_t sVar2;
  pointer *ppuVar3;
  bool bVar4;
  size_t sVar5;
  state_base_t *psVar6;
  iterator __position;
  ulong uVar7;
  state_base_t *psVar8;
  pointer puVar9;
  pointer extraout_RDX;
  pointer local_18;
  pointer local_10;
  
  if ((symbol->super_type).m_initialized == false) {
    local_18 = (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_10 = (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((ctx->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      (this->super_state_base_t)._vptr_state_base_t = (_func_int **)ctx;
      (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = extraout_RDX;
      puVar9 = (pointer)operator_new(8);
      *(undefined ***)puVar9 = &PTR_process_00113d48;
      (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9;
      return;
    }
    (*(ctx->callback)._M_invoker)((_Any_data *)ctx,&local_18,&local_10);
    psVar8 = (state_base_t *)operator_new(0x10);
    psVar8->_vptr_state_base_t = (_func_int **)&PTR_process_00113c28;
    psVar8[1]._vptr_state_base_t = (_func_int **)0x0;
    psVar6 = (ctx->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>
             ._M_head_impl;
    (ctx->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
    _M_head_impl = psVar8;
    if (psVar6 != (state_base_t *)0x0) {
      operator_delete(psVar6);
    }
  }
  else {
    bVar4 = (symbol->super_type).m_storage;
    pbVar1 = &this->b;
    sVar5 = this->cnt;
    sVar2 = sVar5 + 1;
    this->cnt = sVar2;
    uVar7 = 1L << (7U - (char)sVar5 & 0x3f);
    if (bVar4 == true) {
      uVar7 = uVar7 | (pbVar1->super__Base_bitset<1UL>)._M_w;
    }
    else {
      uVar7 = ~uVar7 & (pbVar1->super__Base_bitset<1UL>)._M_w;
    }
    (pbVar1->super__Base_bitset<1UL>)._M_w = uVar7;
    if (sVar2 == 8) {
      local_18 = (pointer)CONCAT71(local_18._1_7_,(uchar)uVar7);
      __position._M_current =
           (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&this->payload,__position,(uchar *)&local_18);
      }
      else {
        *__position._M_current = (uchar)uVar7;
        ppuVar3 = &(this->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      (pbVar1->super__Base_bitset<1UL>)._M_w = 0;
      this->cnt = 0;
    }
  }
  return;
}

Assistant:

void
payload_t::process(symbol_sm_t& ctx, const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.callback(payload.data(), payload.data() + payload.size());
        ctx.state(
            std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else
    {
        b[7 - cnt++] = *symbol;
        if (cnt == b.size())
        {
            payload.push_back(uint8_t(b.to_ulong()));
            b.reset();
            cnt = 0;
        }
    }
}